

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::NoShaders::Run(NoShaders *this)

{
  uint uVar1;
  uint uVar2;
  allocator<char> local_51;
  string local_50 [36];
  int local_2c;
  int local_28;
  int i_1;
  int i;
  int size;
  long error;
  NoShaders *pNStack_10;
  GLuint program;
  NoShaders *this_local;
  
  pNStack_10 = this;
  error._4_4_ = glu::CallLogWrapper::glCreateProgram
                          (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper);
  _i = 0;
  i_1 = 8;
  for (local_28 = 0; local_28 < i_1; local_28 = local_28 + 1) {
    (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
              (this,(ulong)error._4_4_,
               (ulong)*(uint *)(glcts::(anonymous_namespace)::PIQBase::interfaces +
                               (long)local_28 * 4),0x92f5,0,&i);
    if (*(int *)(glcts::(anonymous_namespace)::PIQBase::interfaces + (long)local_28 * 4) != 0x92c0)
    {
      (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
                (this,(ulong)error._4_4_,
                 (ulong)*(uint *)(glcts::(anonymous_namespace)::PIQBase::interfaces +
                                 (long)local_28 * 4),0x92f6,0,&i);
    }
  }
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)error._4_4_,0x92c0,0x92f7,0,&i);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)error._4_4_,0x92e6,0x92f7,0,&i);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)error._4_4_,0x92e2,0x92f7,0,&i);
  for (local_2c = 0; uVar2 = error._4_4_, local_2c < i_1; local_2c = local_2c + 1) {
    if (*(int *)(glcts::(anonymous_namespace)::PIQBase::interfaces + (long)local_2c * 4) != 0x92c0)
    {
      uVar1 = *(uint *)(glcts::(anonymous_namespace)::PIQBase::interfaces + (long)local_2c * 4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_50,"",&local_51);
      (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xe])
                (this,(ulong)uVar2,(ulong)uVar1,local_50,0xffffffff,&i);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator(&local_51);
    }
  }
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             error._4_4_);
  return _i;
}

Assistant:

virtual long Run()
	{
		const GLuint program = glCreateProgram();

		long error = NO_ERROR;
		int  size  = sizeof(PIQBase::interfaces) / sizeof(PIQBase::interfaces[0]);

		for (int i = 0; i < size; ++i)
		{
			VerifyGetProgramInterfaceiv(program, PIQBase::interfaces[i], GL_ACTIVE_RESOURCES, 0, error);
			if (PIQBase::interfaces[i] == GL_ATOMIC_COUNTER_BUFFER)
				continue;
			VerifyGetProgramInterfaceiv(program, PIQBase::interfaces[i], GL_MAX_NAME_LENGTH, 0, error);
		}
		VerifyGetProgramInterfaceiv(program, GL_ATOMIC_COUNTER_BUFFER, GL_MAX_NUM_ACTIVE_VARIABLES, 0, error);
		VerifyGetProgramInterfaceiv(program, GL_SHADER_STORAGE_BLOCK, GL_MAX_NUM_ACTIVE_VARIABLES, 0, error);
		VerifyGetProgramInterfaceiv(program, GL_UNIFORM_BLOCK, GL_MAX_NUM_ACTIVE_VARIABLES, 0, error);

		for (int i = 0; i < size; ++i)
		{
			if (PIQBase::interfaces[i] == GL_ATOMIC_COUNTER_BUFFER)
				continue;
			VerifyGetProgramResourceIndex(program, PIQBase::interfaces[i], "", GL_INVALID_INDEX, error);
		}

		// can't test GetProgramResourceLocation* here since program has to be linked
		// can't test GetProgramResourceiv, need valid index

		glDeleteProgram(program);
		return error;
	}